

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrEnumerateReferenceSpaces
                   (XrSession session,uint32_t spaceCapacityInput,uint32_t *spaceCountOutput,
                   XrReferenceSpaceType *spaces)

{
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar1;
  ValidateXrHandleResult VVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_3c9;
  string local_3c8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3a8;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_318;
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  GenValidUsageXrInstanceInfo *local_2b0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_288 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  XrSession_T local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_54;
  undefined1 local_50 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrReferenceSpaceType *spaces_local;
  uint32_t *spaceCountOutput_local;
  XrSession pXStack_18;
  uint32_t spaceCapacityInput_local;
  XrSession session_local;
  GenValidUsageXrInstanceInfo *instance_info;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  pXStack_18 = session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  local_54 = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_50
             ,&stack0xffffffffffffffe8,&local_54);
  VVar2 = VerifyXrSessionHandle(&stack0xffffffffffffffe8);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,pXStack_18);
    instance_info = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2b0 = instance_info;
    gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)instance_info;
    if ((spaceCapacityInput == 0) || (spaces != (XrReferenceSpaceType *)0x0)) {
      if (spaceCountOutput == (uint32_t *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_360,"VUID-xrEnumerateReferenceSpaces-spaceCountOutput-parameter",&local_361
                  );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_388,"xrEnumerateReferenceSpaces",&local_389);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3a8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3c8,
                   "Invalid NULL for uint32_t \"spaceCountOutput\" which is not optional and must be non-NULL"
                   ,&local_3c9);
        CoreValidLogMessage(instance_info,(string *)local_360,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_388,&local_3a8,(string *)local_3c8);
        std::__cxx11::string::~string(local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3a8);
        std::__cxx11::string::~string(local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        std::__cxx11::string::~string(local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
        pVar1.first = gen_session_info;
        pVar3.second = local_2b0;
        pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
        session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
        pVar1 = pVar3;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d0,"VUID-xrEnumerateReferenceSpaces-spaces-parameter",&local_2d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"xrEnumerateReferenceSpaces",&local_2f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_318,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_338,
                 "Command xrEnumerateReferenceSpaces param spaces is NULL, but spaceCapacityInput is greater than 0"
                 ,&local_339);
      CoreValidLogMessage(instance_info,(string *)local_2d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2f8,&local_318,(string *)local_338);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_318);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_session_info;
      pVar3.second = local_2b0;
      pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_200);
    std::operator<<((ostream *)local_1e0,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_220,"VUID-xrEnumerateReferenceSpaces-session-parameter",&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"xrEnumerateReferenceSpaces",&local_249);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_268,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_50);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_220,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_248,&local_268,local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_268);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
    pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
    pVar1.first = gen_session_info;
    pVar3.second = local_2b0;
    pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
  }
  info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
  gen_session_info = pVar1.first;
  local_2b0 = pVar3.second;
  gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrEnumerateReferenceSpaces(
XrSession session,
uint32_t spaceCapacityInput,
uint32_t* spaceCountOutput,
XrReferenceSpaceType* spaces) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrEnumerateReferenceSpaces-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateReferenceSpaces",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Optional array must be non-NULL when spaceCapacityInput is non-zero
        if (0 != spaceCapacityInput && nullptr == spaces) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateReferenceSpaces-spaces-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateReferenceSpaces",
                                objects_info,
                                "Command xrEnumerateReferenceSpaces param spaces is NULL, but spaceCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == spaceCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateReferenceSpaces-spaceCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateReferenceSpaces", objects_info,
                                "Invalid NULL for uint32_t \"spaceCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrEnumerateReferenceSpaces-spaceCountOutput-parameter" type
                // NOTE: Can't validate "VUID-xrEnumerateReferenceSpaces-spaces-parameter" output enum buffer
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}